

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O0

void oonf_class_event(oonf_class *c,void *ptr,oonf_class_event evt)

{
  char *pcVar1;
  list_entity *plVar2;
  oonf_log_source oVar3;
  char *pcVar4;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_objectkey_str buf;
  oonf_class_extension *ext;
  oonf_class_event evt_local;
  void *ptr_local;
  oonf_class *c_local;
  
  oVar3 = _oonf_class_subsystem.logging;
  if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
    pcVar1 = OONF_CLASS_EVENT_NAME[evt];
    pcVar4 = (*c->to_keystring)((oonf_objectkey_str *)&__tempptr,c,ptr);
    oonf_log(1,oVar3,"src/base/oonf_class.c",0x143,0,0,"Fire \'%s\' event for %s",pcVar1,pcVar4);
  }
  plVar2 = (c->_extensions).next;
  while (buf.buf._120_8_ = &plVar2[-4].prev, plVar2->prev != (c->_extensions).prev) {
    if ((evt == OONF_OBJECT_ADDED) && (plVar2[-2].prev != (list_entity *)0x0)) {
      if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
        oonf_log(1,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x146,0,0,
                 "Fire listener %s",*(undefined8 *)buf.buf._120_8_);
      }
      (**(code **)(buf.buf._120_8_ + 0x20))(ptr);
    }
    else if ((evt == OONF_OBJECT_REMOVED) && (plVar2[-1].prev != (list_entity *)0x0)) {
      if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
        oonf_log(1,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x14a,0,0,
                 "Fire listener %s",*(undefined8 *)buf.buf._120_8_);
      }
      (**(code **)(buf.buf._120_8_ + 0x30))(ptr);
    }
    else if ((evt == OONF_OBJECT_CHANGED) && (plVar2[-1].next != (list_entity *)0x0)) {
      if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
        oonf_log(1,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x14e,0,0,
                 "Fire listener %s",*(undefined8 *)buf.buf._120_8_);
      }
      (**(code **)(buf.buf._120_8_ + 0x28))(ptr);
    }
    plVar2 = *(list_entity **)(buf.buf._120_8_ + 0x38);
  }
  if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
    oonf_log(1,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x152,0,0,"Fire event finished"
            );
  }
  return;
}

Assistant:

void
oonf_class_event(struct oonf_class *c, void *ptr, enum oonf_class_event evt) {
  struct oonf_class_extension *ext;
#ifdef OONF_LOG_DEBUG_INFO
  struct oonf_objectkey_str buf;
#endif

  OONF_DEBUG(LOG_CLASS, "Fire '%s' event for %s", OONF_CLASS_EVENT_NAME[evt], c->to_keystring(&buf, c, ptr));
  list_for_each_element(&c->_extensions, ext, _node) {
    if (evt == OONF_OBJECT_ADDED && ext->cb_add != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_add(ptr);
    }
    else if (evt == OONF_OBJECT_REMOVED && ext->cb_remove != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_remove(ptr);
    }
    else if (evt == OONF_OBJECT_CHANGED && ext->cb_change != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_change(ptr);
    }
  }
  OONF_DEBUG(LOG_CLASS, "Fire event finished");
}